

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O2

void __thiscall Polymer::Initialize(Polymer *this)

{
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *this_00;
  element_type *peVar1;
  element_type *peVar2;
  pointer pIVar3;
  Interval<std::shared_ptr<ReleaseSite>,_unsigned_long> *interval;
  SpeciesTracker *pSVar4;
  pointer pIVar5;
  int iVar6;
  unsigned_long stop;
  pointer pIVar7;
  unsigned_long start;
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  results;
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  term_results;
  __shared_ptr<Polymer,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<Polymer,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::IntervalTree
            ((IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)&results,
             &this->binding_intervals_,0x10,0x40,0,0,0x200);
  this_00 = &this->binding_sites_;
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::operator=
            (this_00,(IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)&results);
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::~IntervalTree
            ((IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)&results);
  IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::IntervalTree
            ((IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)&results,
             &this->release_intervals_,0x10,0x40,0,0,0x200);
  IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::operator=
            (&this->release_sites_,
             (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)&results);
  IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::~IntervalTree
            ((IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)&results);
  results.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  results.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  results.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  start = (unsigned_long)(this->mask_).super_MobileElement.start_;
  stop = (unsigned_long)(this->mask_).super_MobileElement.stop_;
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::findOverlapping
            (this_00,start,stop,&results);
  pIVar3 = results.
           super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pIVar7 = results.
                super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pIVar7 != pIVar3; pIVar7 = pIVar7 + 1) {
    pSVar4 = SpeciesTracker::Instance();
    peVar1 = (pIVar7->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_ptr<Polymer,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Polymer,void>
              (local_40,(__weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2> *)
                        &this->super_enable_shared_from_this<Polymer>);
    SpeciesTracker::Add(pSVar4,&(peVar1->super_FixedElement).name_,(Ptr *)local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    peVar1 = (pIVar7->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar6 = (peVar1->super_FixedElement).covered_ + 1;
    (peVar1->super_FixedElement).covered_ = iVar6;
    (peVar1->super_FixedElement).old_covered_ = iVar6;
  }
  term_results.
  super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  term_results.
  super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  term_results.
  super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::findOverlapping
            (&this->release_sites_,start,stop,&term_results);
  for (pIVar5 = term_results.
                super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pIVar5 != term_results.
                super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pIVar5 = pIVar5 + 1) {
    peVar2 = (pIVar5->value).super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar6 = (peVar2->super_FixedElement).covered_ + 1;
    (peVar2->super_FixedElement).covered_ = iVar6;
    (peVar2->super_FixedElement).old_covered_ = iVar6;
  }
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::clear(&results);
  this->total_elements_ = 0;
  this->degraded_elements_ = 0;
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::findContained
            (this_00,(long)this->start_,start,&results);
  pIVar3 = results.
           super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pIVar7 = results.
                super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pIVar7 != pIVar3; pIVar7 = pIVar7 + 1) {
    pSVar4 = SpeciesTracker::Instance();
    peVar1 = (pIVar7->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_ptr<Polymer,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Polymer,void>
              (local_50,(__weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2> *)
                        &this->super_enable_shared_from_this<Polymer>);
    SpeciesTracker::Add(pSVar4,&(peVar1->super_FixedElement).name_,(Ptr *)local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    peVar1 = (pIVar7->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar6 = (peVar1->super_FixedElement).covered_;
    if (0 < iVar6) {
      iVar6 = iVar6 + -1;
      (peVar1->super_FixedElement).covered_ = iVar6;
    }
    (peVar1->super_FixedElement).old_covered_ = iVar6;
    LogUncover(this,&(peVar1->super_FixedElement).name_);
    this->total_elements_ = this->total_elements_ + 1;
  }
  std::
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ::~vector(&term_results);
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~vector(&results);
  return;
}

Assistant:

void Polymer::Initialize() {
  // Construct invterval trees
  binding_sites_ = IntervalTree<BindingSite::Ptr>(binding_intervals_);
  release_sites_ = IntervalTree<ReleaseSite::Ptr>(release_intervals_);
  std::vector<Interval<BindingSite::Ptr>> results;

  // Cover all masked sites
  int mask_start = mask_.start();
  int mask_stop = mask_.stop();
  binding_sites_.findOverlapping(mask_start, mask_stop, results);

  for (auto &interval : results) {
    // TODO: move to wrapper reaction
    SpeciesTracker::Instance().Add(interval.value->name(), shared_from_this());
    interval.value->Cover();
    interval.value->ResetState();
    // We don't need to log anything here because covered promoters are
    // invisible to SpeciesTracker.
  }

  std::vector<Interval<ReleaseSite::Ptr>> term_results;
  release_sites_.findOverlapping(mask_start, mask_stop, term_results);

  for (auto &interval : term_results) {
    interval.value->Cover();
    interval.value->ResetState();
  }

  // Make sure all unmasked sites are uncovered
  results.clear();
  total_elements_ = 0;
  degraded_elements_ = 0;
  binding_sites_.findContained(start_, mask_start, results);
  for (auto &interval : results) {
    // TODO: Move to bridge reaction
    SpeciesTracker::Instance().Add(interval.value->name(), shared_from_this());
    interval.value->Uncover();
    interval.value->ResetState();
    LogUncover(interval.value->name());
    total_elements_ += 1;
  }

  // for (auto elem : uncovered_) {
  //  std::cout << elem.first + " " + std::to_string(elem.second) << std::endl;
  // }
}